

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cc
# Opt level: O1

string * __thiscall
bloaty::DisassembleFunction_abi_cxx11_
          (string *__return_storage_ptr__,bloaty *this,DisassemblyInfo *info)

{
  uint uVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  uint uVar5;
  bool bVar6;
  cs_err cVar7;
  uint uVar8;
  size_t sVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  size_t sVar12;
  long *plVar13;
  _Rb_tree_node_base *p_Var14;
  undefined8 *puVar15;
  ulong uVar16;
  ulong *puVar17;
  _Rb_tree_node_base *p_Var18;
  size_type *psVar19;
  int iVar20;
  uint uVar21;
  cs_insn *pcVar22;
  char *pcVar23;
  long lVar24;
  string_view from;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string upper_match;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string op_str;
  uint64_t target_1;
  csh handle;
  string match;
  string label;
  cs_insn *insn;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  local_labels;
  string bytes;
  uint64_t target;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  string *local_278;
  char *local_270;
  ulong local_268;
  csh local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248;
  undefined7 uStack_247;
  bloaty *local_238;
  undefined1 local_230 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  cs_insn *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  ulong uStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string *local_1c8;
  size_type sStack_1c0;
  undefined1 local_1b8 [24];
  _Rb_tree_node_base local_1a0;
  undefined8 local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  bloaty *local_170;
  cs_insn *local_168;
  char *local_160;
  size_t local_158;
  char *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  ulong uStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  undefined1 local_108 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  undefined8 local_d8;
  _Alloc_hider local_d0;
  ulong local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  char *local_b0;
  
  local_178 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_178;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_278 = __return_storage_ptr__;
  cVar7 = cs_open(*(cs_arch *)(this + 0x70),*(cs_mode *)(this + 0x74),&local_260);
  iVar20 = 0x8d;
  pcVar23 = "Couldn\'t initialize Capstone";
  if ((cVar7 == CS_ERR_OK) && (cVar7 = cs_option(local_260,CS_OPT_DETAIL,3), cVar7 == CS_ERR_OK)) {
    if (*(size_t *)this != 0) {
      sVar9 = cs_disasm(local_260,*(uint8_t **)(this + 8),*(size_t *)this,*(uint64_t *)(this + 0x78)
                        ,0,&local_1f0);
      if (sVar9 == 0) {
        Throw("Error disassembling function.",0x9a);
      }
      local_1a0._M_color = 0;
      lVar24 = 0;
      local_1a0._M_parent = (_Rb_tree_node_base *)0x0;
      local_180 = 0;
      local_270 = (char *)sVar9;
      local_1a0._M_left = &local_1a0;
      local_1a0._M_right = &local_1a0;
      do {
        bVar6 = TryGetJumpTarget(*(cs_arch *)(this + 0x70),
                                 (cs_insn *)(local_1f0->bytes + lVar24 + -0x12),
                                 (uint64_t *)local_108);
        if (((bVar6) && (*(ulong **)(this + 0x78) <= (ulong)local_108._0_8_)) &&
           ((ulong)local_108._0_8_ < (ulong *)((long)*(ulong **)(this + 0x78) + *(long *)this))) {
          pmVar10 = std::
                    map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                    ::operator[]((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                                  *)(local_1b8 + 0x10),(key_type *)local_108);
          *pmVar10 = 0;
        }
        lVar24 = lVar24 + 0xf8;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
      if (local_1a0._M_left != &local_1a0) {
        iVar20 = 0;
        p_Var11 = local_1a0._M_left;
        do {
          *(int *)&p_Var11[1]._M_parent = iVar20;
          iVar20 = iVar20 + 1;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != &local_1a0);
      }
      local_170 = this + 0x10;
      local_270 = (char *)((long)local_270 + (ulong)(local_270 == (char *)0x0));
      pcVar23 = (char *)0x0;
      local_238 = this;
      do {
        pcVar22 = local_1f0;
        from._M_len = local_1f0[(long)pcVar23].bytes;
        from._M_str = pcVar23;
        local_160 = pcVar23;
        absl::BytesToHexString_abi_cxx11_
                  (&local_128,(absl *)(ulong)local_1f0[(long)pcVar23].size,from);
        pcVar22 = pcVar22 + (long)pcVar23;
        local_150 = pcVar22->mnemonic;
        local_158 = strlen(local_150);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        sVar12 = strlen(pcVar22->op_str);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,pcVar22->op_str,pcVar22->op_str + sVar12);
        local_258._M_allocated_capacity = (size_type)&local_248;
        local_258._8_8_ = 0;
        local_248 = 0;
        local_210._M_allocated_capacity = (size_type)&local_200;
        local_210._8_8_ = 0;
        local_200._M_local_buf[0] = '\0';
        if (*(int *)(local_238 + 0x70) == 3) {
          if (pcVar22->id == 0x142) {
            re2::RE2::RE2((RE2 *)local_108,"\\w?word ptr ");
            local_148 = &local_138;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,anon_var_dwarf_3f9a61 + 0x11);
            local_2d8._M_dataplus._M_p = (pointer)local_148;
            local_2d8._M_string_length = uStack_140;
            re2::RE2::GlobalReplace(&local_298,(RE2 *)local_108,(StringPiece *)&local_2d8);
            if (local_148 != &local_138) {
              operator_delete(local_148,local_138._M_allocated_capacity + 1);
            }
            re2::RE2::~RE2((RE2 *)local_108);
          }
          else if (pcVar22->id == 0x1ee) {
            local_298._M_string_length = 0;
            *local_298._M_dataplus._M_p = '\0';
          }
          else {
            while( true ) {
              re2::RE2::RE2((RE2 *)local_108,"(\\w?word) ptr");
              local_2b8._M_dataplus._M_p = (pointer)&local_258;
              local_2b8._M_string_length = (size_type)re2::RE2::Arg::parse_string;
              local_2d8._M_dataplus._M_p = local_298._M_dataplus._M_p;
              local_2d8._M_string_length = local_298._M_string_length;
              local_230._0_8_ = &local_2b8;
              bVar6 = re2::RE2::PartialMatchN
                                ((StringPiece *)&local_2d8,(RE2 *)local_108,(Arg **)local_230,1);
              re2::RE2::~RE2((RE2 *)local_108);
              if (!bVar6) break;
              local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2d8,local_258._M_allocated_capacity,
                         (undefined1 *)(local_258._M_allocated_capacity + local_258._8_8_));
              absl::AsciiStrToUpper(&local_2d8);
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b8,local_258._M_allocated_capacity,
                         (undefined1 *)(local_258._M_allocated_capacity + local_258._8_8_));
              std::__cxx11::string::append((char *)&local_2b8);
              re2::RE2::RE2((RE2 *)local_108,&local_2b8);
              local_1c8 = (string *)local_1b8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,local_2d8._M_dataplus._M_p,
                         local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
              local_230._0_8_ = local_1c8;
              local_230._8_8_ = sStack_1c0;
              re2::RE2::Replace(&local_298,(RE2 *)local_108,(StringPiece *)local_230);
              if (local_1c8 != (string *)local_1b8) {
                operator_delete(local_1c8,(ulong)(local_1b8._0_8_ + 1));
              }
              re2::RE2::~RE2((RE2 *)local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                local_2d8.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
        re2::RE2::RE2((RE2 *)local_108," ");
        local_1e8 = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,anon_var_dwarf_3f9a61 + 0x11);
        local_2d8._M_dataplus._M_p = (pointer)local_1e8;
        local_2d8._M_string_length = uStack_1e0;
        re2::RE2::GlobalReplace(&local_298,(RE2 *)local_108,(StringPiece *)&local_2d8);
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,local_1d8._M_allocated_capacity + 1);
        }
        re2::RE2::~RE2((RE2 *)local_108);
        p_Var14 = &local_1a0;
        if (local_1a0._M_parent != (_Rb_tree_node_base *)0x0) {
          p_Var11 = local_1a0._M_parent;
          do {
            bVar6 = *(ulong *)(p_Var11 + 1) < pcVar22->address;
            if (!bVar6) {
              p_Var14 = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[bVar6];
          } while (p_Var11 != (_Base_ptr)0x0);
        }
        p_Var18 = &local_1a0;
        if ((p_Var14 != &local_1a0) &&
           (p_Var18 = p_Var14, pcVar22->address < *(ulong *)(p_Var14 + 1))) {
          p_Var18 = &local_1a0;
        }
        if (p_Var18 != &local_1a0) {
          local_168 = pcVar22;
          uVar1 = *(uint *)&p_Var18[1]._M_parent;
          uVar2 = -uVar1;
          if (0 < (int)uVar1) {
            uVar2 = uVar1;
          }
          uVar21 = 1;
          if (9 < uVar2) {
            uVar16 = (ulong)uVar2;
            uVar5 = 4;
            do {
              uVar21 = uVar5;
              uVar8 = (uint)uVar16;
              if (uVar8 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_0018f1df;
              }
              if (uVar8 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_0018f1df;
              }
              if (uVar8 < 10000) goto LAB_0018f1df;
              uVar16 = uVar16 / 10000;
              uVar5 = uVar21 + 4;
            } while (99999 < uVar8);
            uVar21 = uVar21 + 1;
          }
LAB_0018f1df:
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_2d8,(char)uVar21 - (char)((int)uVar1 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_2d8._M_dataplus._M_p + (uVar1 >> 0x1f),uVar21,uVar2);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_2d8);
          pcVar22 = local_168;
          puVar17 = (ulong *)(plVar13 + 2);
          if ((ulong *)*plVar13 == puVar17) {
            local_108._16_8_ = *puVar17;
            local_108._24_8_ = plVar13[3];
            local_108._0_8_ = local_108 + 0x10;
          }
          else {
            local_108._16_8_ = *puVar17;
            local_108._0_8_ = (ulong *)*plVar13;
          }
          local_108._8_8_ = plVar13[1];
          *plVar13 = (long)puVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_210._M_local_buf,(string *)local_108);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
        }
        bVar6 = TryGetJumpTarget(*(cs_arch *)(local_238 + 0x70),pcVar22,&local_268);
        if (bVar6) {
          p_Var14 = &local_1a0;
          for (p_Var11 = local_1a0._M_parent; p_Var11 != (_Rb_tree_node_base *)0x0;
              p_Var11 = (&p_Var11->_M_left)[*(ulong *)(p_Var11 + 1) < local_268]) {
            if (*(ulong *)(p_Var11 + 1) >= local_268) {
              p_Var14 = p_Var11;
            }
          }
          p_Var18 = &local_1a0;
          if ((p_Var14 != &local_1a0) && (p_Var18 = p_Var14, local_268 < *(ulong *)(p_Var14 + 1))) {
            p_Var18 = &local_1a0;
          }
          local_108._0_8_ = local_108 + 0x10;
          local_108._8_8_ = (char *)0x0;
          local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
          if (p_Var18 == &local_1a0) {
            bVar6 = RangeMap::TryGetLabel((RangeMap *)local_170,local_268,(string *)local_108);
            if (bVar6) {
              std::__cxx11::string::_M_assign((string *)&local_298);
            }
          }
          else {
            if (pcVar22->address < local_268) {
              uVar1 = *(uint *)&p_Var18[1]._M_parent;
              uVar2 = -uVar1;
              if (0 < (int)uVar1) {
                uVar2 = uVar1;
              }
              uVar21 = 1;
              if (9 < uVar2) {
                uVar16 = (ulong)uVar2;
                uVar5 = 4;
                do {
                  uVar21 = uVar5;
                  uVar8 = (uint)uVar16;
                  if (uVar8 < 100) {
                    uVar21 = uVar21 - 2;
                    goto LAB_0018f475;
                  }
                  if (uVar8 < 1000) {
                    uVar21 = uVar21 - 1;
                    goto LAB_0018f475;
                  }
                  if (uVar8 < 10000) goto LAB_0018f475;
                  uVar16 = uVar16 / 10000;
                  uVar5 = uVar21 + 4;
                } while (99999 < uVar8);
                uVar21 = uVar21 + 1;
              }
LAB_0018f475:
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_2b8,(char)uVar21 - (char)((int)uVar1 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_2b8._M_dataplus._M_p + (uVar1 >> 0x1f),uVar21,uVar2);
              puVar15 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x34974b);
            }
            else {
              uVar1 = *(uint *)&p_Var18[1]._M_parent;
              uVar2 = -uVar1;
              if (0 < (int)uVar1) {
                uVar2 = uVar1;
              }
              uVar21 = 1;
              if (9 < uVar2) {
                uVar16 = (ulong)uVar2;
                uVar5 = 4;
                do {
                  uVar21 = uVar5;
                  uVar8 = (uint)uVar16;
                  if (uVar8 < 100) {
                    uVar21 = uVar21 - 2;
                    goto LAB_0018f4c7;
                  }
                  if (uVar8 < 1000) {
                    uVar21 = uVar21 - 1;
                    goto LAB_0018f4c7;
                  }
                  if (uVar8 < 10000) goto LAB_0018f4c7;
                  uVar16 = uVar16 / 10000;
                  uVar5 = uVar21 + 4;
                } while (99999 < uVar8);
                uVar21 = uVar21 + 1;
              }
LAB_0018f4c7:
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_2b8,(char)uVar21 - (char)((int)uVar1 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_2b8._M_dataplus._M_p + (uVar1 >> 0x1f),uVar21,uVar2);
              puVar15 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x5b4ba2);
            }
            psVar19 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar19) {
              local_2d8.field_2._M_allocated_capacity = *psVar19;
              local_2d8.field_2._8_8_ = puVar15[3];
              local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            }
            else {
              local_2d8.field_2._M_allocated_capacity = *psVar19;
              local_2d8._M_dataplus._M_p = (pointer)*puVar15;
            }
            local_2d8._M_string_length = puVar15[1];
            *puVar15 = psVar19;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_298,(string *)&local_2d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
        }
        anon_unknown_6::RightPad(&local_2d8,(string *)&local_210,4);
        sVar4 = local_2d8._M_string_length;
        _Var3._M_p = local_2d8._M_dataplus._M_p;
        local_230._0_8_ = (string *)(local_230 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,local_150,local_150 + local_158);
        anon_unknown_6::RightPad(&local_2b8,(string *)local_230,8);
        local_108._0_8_ = (ulong *)0x1;
        local_108._8_8_ = " ";
        local_108._16_8_ = sVar4;
        local_108._24_8_ = _Var3._M_p;
        local_108._32_8_ = local_2b8._M_string_length;
        local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_2b8._M_dataplus._M_p;
        local_d8._0_1_ = true;
        local_d8._1_1_ = false;
        local_d8._2_1_ = false;
        local_d8._3_1_ = false;
        local_d8._4_1_ = false;
        local_d8._5_1_ = false;
        local_d8._6_1_ = false;
        local_d8._7_1_ = false;
        local_d0._M_p = " ";
        local_c8 = local_298._M_string_length;
        local_c0._M_allocated_capacity = (size_type)local_298._M_dataplus._M_p;
        local_c0._8_8_ = 1;
        local_b0 = "\n";
        pieces._M_len = local_2b8._M_string_length;
        pieces._M_array = (iterator)0x6;
        absl::strings_internal::AppendPieces
                  ((strings_internal *)local_278,(Nonnull<std::string_*>)local_108,pieces);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_230._0_8_ != (string *)(local_230 + 0x10)) {
          operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_allocated_capacity != &local_200) {
          operator_delete((void *)local_210._M_allocated_capacity,
                          CONCAT71(local_200._M_allocated_capacity._1_7_,local_200._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_258._M_allocated_capacity != &local_248) {
          operator_delete((void *)local_258._M_allocated_capacity,CONCAT71(uStack_247,local_248) + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        pcVar23 = local_160 + 1;
        if (pcVar23 == local_270) {
          cs_close(&local_260);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                       *)(local_1b8 + 0x10));
          return local_278;
        }
      } while( true );
    }
    iVar20 = 0x91;
    pcVar23 = "Tried to disassemble empty function.";
  }
  Throw(pcVar23,iVar20);
}

Assistant:

std::string DisassembleFunction(const DisassemblyInfo& info) {
  std::string ret;

  csh handle;
  if (cs_open(info.arch, info.mode, &handle) != CS_ERR_OK ||
      cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON) != CS_ERR_OK) {
    THROW("Couldn't initialize Capstone");
  }

  if (info.text.size() == 0) {
    THROW("Tried to disassemble empty function.");
  }

  cs_insn *insn;
  size_t count =
      cs_disasm(handle, reinterpret_cast<const uint8_t *>(info.text.data()),
                info.text.size(), info.start_address, 0, &insn);

  if (count == 0) {
    THROW("Error disassembling function.");
  }

  std::map<uint64_t, int> local_labels;

  for (size_t i = 0; i < count; i++) {
    cs_insn *in = insn + i;
    uint64_t target;
    if (TryGetJumpTarget(info.arch, in, &target) &&
        target >= info.start_address &&
        target < info.start_address + info.text.size()) {
      local_labels[target] = 0;  // Fill in real value later.
    }
  }

  int label = 0;
  for (auto& pair : local_labels) {
    pair.second = label++;
  }

  for (size_t i = 0; i < count; i++) {
    cs_insn *in = insn + i;
    std::string bytes = absl::BytesToHexString(
        string_view(reinterpret_cast<const char*>(in->bytes), in->size));
    string_view mnemonic(in->mnemonic);
    std::string op_str(in->op_str);
    std::string match;
    std::string label;

    if (info.arch == CS_ARCH_X86) {
      if (in->id == X86_INS_LEA) {
        ReImpl::GlobalReplace(&op_str, "\\w?word ptr ", "");
      } else if (in->id == X86_INS_NOP) {
        op_str.clear();
      } else {
        // qword ptr => QWORD
        while (ReImpl::PartialMatch(op_str, "(\\w?word) ptr", &match)) {
          std::string upper_match = match;
          absl::AsciiStrToUpper(&upper_match);
          ReImpl::Replace(&op_str, match + " ptr", upper_match);
        }
      }
    }

    ReImpl::GlobalReplace(&op_str, " ", "");

    auto iter = local_labels.find(in->address);
    if (iter != local_labels.end()) {
      label = std::to_string(iter->second) + ":";
    }

    uint64_t target;
    if (TryGetJumpTarget(info.arch, in, &target)) {
      auto iter = local_labels.find(target);
      std::string label;
      if (iter != local_labels.end()) {
        if (target > in->address) {
          op_str = ">" + std::to_string(iter->second);
        } else {
          op_str = "<" + std::to_string(iter->second);
        }
      } else if (info.symbol_map.vm_map.TryGetLabel(target, &label)) {
        op_str = label;
      }
    }

    absl::StrAppend(&ret, " ", RightPad(label, 4),
                    RightPad(std::string(mnemonic), 8), " ", op_str, "\n");
  }

  cs_close(&handle);
  return ret;
}